

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::RootAddRef(Recycler *this,void *obj,uint *count)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  PinRecord *pPVar5;
  ConfigFlagsTable *pCVar6;
  StackBackTrace *pSVar7;
  undefined8 *in_FS_OFFSET;
  uint local_3c;
  PinRecord *refCount_1;
  PinRecord *refCount;
  uint *count_local;
  void *obj_local;
  Recycler *this_local;
  
  BVar3 = IsValidObject(this,obj,0);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x23e,"(this->IsValidObject(obj))","this->IsValidObject(obj)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (this->transientPinnedObject != (void *)0x0) {
    pPVar5 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::GetReference(&this->pinnedObjectMap,this->transientPinnedObject);
    PinRecord::operator++(pPVar5);
    uVar4 = PinRecord::operator_cast_to_unsigned_int(pPVar5);
    if (uVar4 == 1) {
      this->scanPinnedObjectMap = true;
    }
    pCVar6 = GetRecyclerFlagsTable(this);
    if ((pCVar6->LeakStackTrace & 1U) != 0) {
      StackBackTraceNode::Prepend<Memory::NoCheckHeapAllocator>
                ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,&pPVar5->stackBackTraces,
                 this->transientPinnedObjectStackBackTrace);
    }
  }
  if (count != (uint *)0x0) {
    pPVar5 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::TryGetReference(&this->pinnedObjectMap,obj);
    if (pPVar5 == (PinRecord *)0x0) {
      local_3c = 1;
    }
    else {
      local_3c = PinRecord::operator_cast_to_unsigned_int(pPVar5);
      local_3c = local_3c + 1;
    }
    *count = local_3c;
  }
  this->transientPinnedObject = obj;
  pCVar6 = GetRecyclerFlagsTable(this);
  if ((pCVar6->LeakStackTrace & 1U) != 0) {
    pSVar7 = StackBackTrace::Capture<Memory::NoCheckHeapAllocator>
                       ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0,0x1e);
    this->transientPinnedObjectStackBackTrace = pSVar7;
  }
  return;
}

Assistant:

void
Recycler::RootAddRef(void* obj, uint *count)
{
    Assert(this->IsValidObject(obj));

    if (transientPinnedObject)
    {
        PinRecord& refCount = pinnedObjectMap.GetReference(transientPinnedObject);
        ++refCount;
        if (refCount == 1)
        {
            this->scanPinnedObjectMap = true;
            RECYCLER_PERF_COUNTER_INC(PinnedObject);
        }
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
        if (GetRecyclerFlagsTable().LeakStackTrace)
        {
            StackBackTraceNode::Prepend(&NoCheckHeapAllocator::Instance, refCount.stackBackTraces,
                transientPinnedObjectStackBackTrace);
        }
#endif
#endif
    }

    if (count != nullptr)
    {
        PinRecord* refCount = pinnedObjectMap.TryGetReference(obj);
        *count = (refCount != nullptr) ? (*refCount + 1) : 1;
    }

    transientPinnedObject = obj;

#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
    if (GetRecyclerFlagsTable().LeakStackTrace)
    {
        transientPinnedObjectStackBackTrace = StackBackTrace::Capture(&NoCheckHeapAllocator::Instance);
    }
#endif
#endif
}